

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  Bounds2<float> *pBVar1;
  float fVar2;
  size_t sVar3;
  Bounds2<float> *pBVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  Float FVar12;
  undefined1 auVar13 [16];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar19 [56];
  undefined1 auVar18 [64];
  undefined1 in_ZMM4 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Bounds2<float> BVar20;
  Bounds2<float> local_b8;
  Point2f u2;
  undefined1 local_80 [20];
  undefined8 local_6c;
  MediumHandle local_60;
  Ray testOut;
  undefined1 extraout_var [56];
  
  auVar13 = in_ZMM4._0_16_;
  fVar2 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20);
  if (TestExitPupilBounds()::rng == '\0') {
    iVar8 = __cxa_guard_acquire(&TestExitPupilBounds()::rng);
    if (iVar8 != 0) {
      TestExitPupilBounds::rng.state = 0x853c49e6748fea9b;
      TestExitPupilBounds::rng.inc = 0xda3e39cb94b95bdb;
      __cxa_guard_release(&TestExitPupilBounds()::rng);
    }
  }
  fVar10 = RNG::Uniform<float>(&TestExitPupilBounds::rng);
  sVar3 = (this->exitPupilBounds).nStored;
  pBVar4 = (this->exitPupilBounds).ptr;
  iVar8 = (int)sVar3;
  iVar6 = iVar8 + -1;
  fVar10 = fVar2 * fVar10 * 0.5;
  auVar13 = vcvtusi2ss_avx512f(auVar13,sVar3 - 1);
  auVar19 = ZEXT856(auVar13._8_8_);
  auVar13 = ZEXT416((uint)((fVar10 / (fVar2 * 0.5)) * auVar13._0_4_));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  iVar7 = (int)auVar13._0_4_;
  if (iVar6 < (int)auVar13._0_4_) {
    iVar7 = iVar6;
  }
  iVar6 = iVar7 + 1;
  pBVar1 = pBVar4 + iVar7;
  local_b8 = *pBVar1;
  auVar16 = ZEXT856((ulong)(pBVar1->pMax).super_Tuple2<pbrt::Point2,_float>);
  if (iVar6 < iVar8) {
    BVar20 = Union<float>(&local_b8,pBVar4 + iVar6);
    auVar18._0_8_ = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar18._8_56_ = auVar19;
    auVar14._0_8_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar14._8_56_ = auVar16;
    local_b8 = (Bounds2<float>)vmovlhps_avx(auVar14._0_16_,auVar18._0_16_);
  }
  iVar8 = 1000;
  do {
    do {
      bVar9 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar9) {
        fputc(0x2e,_stderr);
        return;
      }
      fVar11 = RNG::Uniform<float>(&TestExitPupilBounds::rng);
      u2.super_Tuple2<pbrt::Point2,_float>.y = RNG::Uniform<float>(&TestExitPupilBounds::rng);
      u2.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
      auVar15._0_8_ = SampleUniformDiskConcentric(&u2);
      auVar15._8_56_ = extraout_var;
      fVar11 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
      testOut.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      fVar5 = auVar15._0_4_ * fVar11;
      auVar13 = vmovshdup_avx(auVar15._0_16_);
      fVar11 = auVar13._0_4_ * fVar11;
      auVar17 = ZEXT816(0);
      testOut.o.super_Tuple3<pbrt::Point3,_float> = auVar17._0_12_;
      testOut.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      testOut._16_12_ = auVar17._4_12_;
      auVar13 = vinsertps_avx(ZEXT416((uint)(fVar5 - fVar10)),ZEXT416((uint)fVar11),0x10);
      local_80._4_16_ = vmovlhps_avx(auVar17,auVar13);
      local_6c._0_4_ = 0.0;
      local_6c._4_4_ = 0.0;
      local_60.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_80._0_4_ = fVar10;
      FVar12 = TraceLensesFromFilm(this,(Ray *)local_80,&testOut);
    } while ((FVar12 == 0.0) && (!NAN(FVar12)));
  } while ((local_b8.pMin.super_Tuple2<pbrt::Point2,_float>.x <= fVar5) &&
          (((fVar5 <= local_b8.pMax.super_Tuple2<pbrt::Point2,_float>.x &&
            (local_b8.pMin.super_Tuple2<pbrt::Point2,_float>.y <= fVar11)) &&
           (fVar11 <= local_b8.pMax.super_Tuple2<pbrt::Point2,_float>.y))));
  fprintf(_stderr,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",(double)fVar5,
          (double)fVar11,(double)local_b8.pMin.super_Tuple2<pbrt::Point2,_float>.x,
          (double)local_b8.pMin.super_Tuple2<pbrt::Point2,_float>.y,
          (double)local_b8.pMax.super_Tuple2<pbrt::Point2,_float>.x,
          (double)local_b8.pMax.super_Tuple2<pbrt::Point2,_float>.y);
  auVar13._4_12_ = in_register_00001384;
  auVar13._0_4_ = in_XMM6_Da;
  auVar13 = vcvtusi2ss_avx512f(auVar13,(this->exitPupilBounds).nStored);
  RenderExitPupil(this,((float)iVar7 / auVar13._0_4_) * fVar2 * 0.5,0.0,"low.exr");
  auVar17._4_12_ = in_register_00001384;
  auVar17._0_4_ = in_XMM6_Da;
  auVar13 = vcvtusi2ss_avx512f(auVar17,(this->exitPupilBounds).nStored);
  RenderExitPupil(this,((float)iVar6 / auVar13._0_4_) * fVar2 * 0.5,0.0,"high.exr");
  RenderExitPupil(this,fVar10,0.0,"mid.exr");
  exit(0);
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   std::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}